

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O0

ecs_column_t * da_get_or_create_column(ecs_world_t *world,ecs_table_t *table,int32_t column)

{
  ecs_data_t *result;
  ecs_data_t *data;
  ecs_column_t *c;
  int32_t column_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  data = (ecs_data_t *)da_get_column(table,column);
  if ((data == (ecs_data_t *)0x0) &&
     ((table->data == (ecs_data_t *)0x0 || (table->data->columns == (ecs_column_t *)0x0)))) {
    result = ecs_table_get_or_create_data(table);
    ecs_init_data(world,table,result);
    data = (ecs_data_t *)da_get_column(table,column);
  }
  _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"c != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
              ,0x24);
  if (data != (ecs_data_t *)0x0) {
    return (ecs_column_t *)data;
  }
  __assert_fail("c != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0x24,"ecs_column_t *da_get_or_create_column(ecs_world_t *, ecs_table_t *, int32_t)"
               );
}

Assistant:

static
ecs_column_t *da_get_or_create_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column)
{
    ecs_column_t *c = da_get_column(table, column);
    if (!c && (!table->data || !table->data->columns)) {
        ecs_data_t *data = ecs_table_get_or_create_data(table);
        ecs_init_data(world, table, data);
        c = da_get_column(table, column);
    }
    ecs_assert(c != NULL, ECS_INTERNAL_ERROR, NULL);
    return c;
}